

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  pid_t pVar5;
  gid_t gVar6;
  _func_int_sqlite3_file_ptr *p_Var7;
  sqlite3_vfs *psVar8;
  ulong uVar9;
  __pid_t _Var10;
  int iVar11;
  sqlite3_io_methods *psVar12;
  size_t sVar13;
  int *piVar14;
  char *zFile;
  UnixUnusedFd *p;
  sqlite3_io_methods *psVar15;
  sqlite3_mutex *psVar16;
  mode_t m;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  sqlite3_io_methods *psVar20;
  uint uVar21;
  unixInodeInfo **ppuVar22;
  uint uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  uint local_4a0;
  gid_t gid;
  uid_t uid;
  ulong local_488;
  uint local_47c;
  sqlite3_io_methods *local_478;
  uint local_46c;
  mode_t openMode;
  char cStack_464;
  char cStack_463;
  char cStack_462;
  char cStack_461;
  undefined8 uStack_460;
  undefined8 local_450;
  char zDb [513];
  char zTmpname [514];
  
  pVar5 = randomnessPid;
  uVar23 = flags & 0xfff00;
  local_488 = (ulong)(flags & 4U);
  if (((flags & 4U) == 0) ||
     (((bVar4 = true, uVar23 != 0x800 && (uVar23 != 0x4000)) && (uVar23 != 0x80000)))) {
    bVar4 = false;
  }
  local_478 = (sqlite3_io_methods *)zPath;
  _Var10 = getpid();
  if (pVar5 != _Var10) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  psVar15 = local_478;
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pFile[0xe].pMethods = (sqlite3_io_methods *)0x0;
  local_47c = uVar23;
  if (uVar23 == 0x100) {
    psVar12 = (sqlite3_io_methods *)findReusableFd((char *)local_478,flags);
    if (psVar12 == (sqlite3_io_methods *)0x0) {
      psVar12 = (sqlite3_io_methods *)sqlite3_malloc64(0x10);
      if (psVar12 == (sqlite3_io_methods *)0x0) {
        return 7;
      }
      uVar23 = 0xffffffff;
    }
    else {
      uVar23 = psVar12->iVersion;
    }
    pFile[6].pMethods = psVar12;
  }
  else {
    uVar23 = 0xffffffff;
    if (local_478 == (sqlite3_io_methods *)0x0) {
      psVar15 = (sqlite3_io_methods *)zTmpname;
      uVar23 = 0xffffffff;
      iVar11 = unixGetTempname(pVfs->mxPathname,(char *)psVar15);
      if (iVar11 != 0) {
        return iVar11;
      }
    }
  }
  uVar21 = flags & 8;
  local_4a0 = flags & 1;
  local_450 = pVfs;
  if ((int)uVar23 < 0) {
    _openMode = _openMode & 0xffffffff00000000;
    uid = 0;
    gid = 0;
    uVar24 = flags & 0x80800;
    if (uVar24 == 0) {
      m = 0x180;
      if ((uVar21 == 0) && (m = 0, (flags & 0x40U) != 0)) {
        zFile = sqlite3_uri_parameter((char *)psVar15,"modeof");
        m = 0;
        if (zFile != (char *)0x0) goto LAB_00117fcd;
      }
    }
    else {
      uVar23 = sqlite3Strlen30((char *)psVar15);
      iVar11 = 0;
      uVar9 = (ulong)uVar23;
      do {
        uVar18 = uVar9;
        if (((long)uVar18 < 2) || (cVar2 = *(char *)((long)psVar15 + (uVar18 - 1)), cVar2 == '.'))
        goto LAB_00117fda;
        uVar9 = uVar18 - 1;
      } while (cVar2 != '-');
      zFile = zDb;
      memcpy(zFile,psVar15,uVar18 - 1);
      zDb[uVar18 - 1] = '\0';
LAB_00117fcd:
      iVar11 = getFileMode(zFile,&openMode,&uid,&gid);
LAB_00117fda:
      if (iVar11 != 0) {
        return iVar11;
      }
      m = openMode;
    }
    uVar19 = (flags & 2U) + (int)local_488 * 0x10 + (flags & 0x10U) * 8 + 0x20000;
    local_488 = CONCAT44(local_488._4_4_,m);
    uVar23 = robust_open((char *)psVar15,uVar19,m);
    if (-1 < (int)uVar23) {
LAB_0011802d:
      gVar6 = gid;
      if (uVar24 != 0 && (mode_t)local_488 != 0) {
        local_488 = CONCAT44(local_488._4_4_,uid);
        iVar11 = (*aSyscall[0x15].pCurrent)();
        if (iVar11 == 0) {
          (*aSyscall[0x14].pCurrent)((ulong)uVar23,local_488 & 0xffffffff,(ulong)gVar6);
        }
      }
      goto LAB_00117d20;
    }
    local_46c = uVar19;
    piVar14 = __errno_location();
    if ((bVar4) && (*piVar14 == 0xd)) {
      bVar3 = false;
      iVar11 = (*aSyscall[2].pCurrent)(psVar15,0);
      if (iVar11 == 0) goto LAB_001180cd;
      iVar11 = 0x608;
    }
    else {
LAB_001180cd:
      bVar3 = true;
      iVar11 = 0;
      if (((flags & 2U) != 0) && (*piVar14 != 0x15)) {
        flags = (flags & 0xfffffff8U) + 1;
        p = findReusableFd((char *)psVar15,flags);
        if (p == (UnixUnusedFd *)0x0) {
          uVar23 = robust_open((char *)psVar15,local_46c & 0x20080,(mode_t)local_488);
        }
        else {
          uVar23 = p->fd;
          sqlite3_free(p);
        }
        iVar11 = 0;
        if (-1 < (int)uVar23) {
          local_4a0 = 1;
          goto LAB_0011802d;
        }
      }
    }
    iVar17 = sqlite3CantopenError(0xaee7);
    unixLogErrorAtLine(iVar17,"open",(char *)psVar15,0xaee7);
    if (bVar3) {
      iVar11 = iVar17;
    }
LAB_0011829c:
    sqlite3_free(pFile[6].pMethods);
  }
  else {
LAB_00117d20:
    uVar24 = local_47c;
    if (pOutFlags != (int *)0x0) {
      *pOutFlags = flags;
    }
    psVar15 = pFile[6].pMethods;
    if (psVar15 != (sqlite3_io_methods *)0x0) {
      psVar15->iVersion = uVar23;
      *(uint *)&psVar15->field_0x4 = flags & 3;
    }
    if (uVar21 != 0) {
      (*aSyscall[0x10].pCurrent)();
    }
    psVar8 = local_450;
    uVar19 = uVar21 * 4 + 2;
    if (local_4a0 == 0) {
      uVar19 = uVar21 * 4;
    }
    uVar21 = uVar19 + 0x80;
    if (uVar24 == 0x100) {
      uVar21 = uVar19;
    }
    uVar24 = uVar21 | 8;
    if (!bVar4) {
      uVar24 = uVar21;
    }
    *(uint *)&pFile[3].pMethods = uVar23;
    pFile[1].pMethods = (sqlite3_io_methods *)local_450;
    pFile[7].pMethods = local_478;
    *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar24;
    pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
    psVar15 = (sqlite3_io_methods *)0x0;
    if ((flags & 0x40U) != 0 || (uVar24 & 0x40) != 0) {
      psVar15 = local_478;
    }
    iVar11 = sqlite3_uri_boolean((char *)psVar15,"psow",1);
    if (iVar11 != 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar11 = strcmp(psVar8->zName,"unix-excl");
    psVar15 = local_478;
    if (iVar11 == 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((char)uVar24 < '\0') {
      psVar12 = &nolockIoMethods;
LAB_00117e89:
      *(undefined4 *)&pFile[4].pMethods = 0;
    }
    else {
      psVar12 = (sqlite3_io_methods *)(**psVar8->pAppData)(local_478,pFile);
      psVar20 = &posixIoMethods;
      if (psVar12 == &posixIoMethods) {
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
        }
        iVar11 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,zDb);
        if (iVar11 == 0) {
          openMode._0_1_ = zDb[0];
          openMode._1_1_ = zDb[1];
          openMode._2_1_ = zDb[2];
          openMode._3_1_ = zDb[3];
          cStack_464 = zDb[4];
          cStack_463 = zDb[5];
          cStack_462 = zDb[6];
          cStack_461 = zDb[7];
          uVar9 = _openMode;
          uStack_460 = (_func_int_sqlite3_file_ptr *)zDb._8_8_;
          p_Var7 = uStack_460;
          ppuVar22 = &inodeList;
          while (psVar15 = (sqlite3_io_methods *)*ppuVar22, _openMode = uVar9, uStack_460 = p_Var7,
                psVar15 != (sqlite3_io_methods *)0x0) {
            openMode._0_1_ = (char)zDb._0_8_;
            openMode._1_1_ = SUB81(zDb._0_8_,1);
            openMode._2_1_ = SUB81(zDb._0_8_,2);
            openMode._3_1_ = SUB81(zDb._0_8_,3);
            cStack_464 = SUB81(zDb._0_8_,4);
            cStack_463 = SUB81(zDb._0_8_,5);
            cStack_462 = SUB81(zDb._0_8_,6);
            cStack_461 = SUB81(zDb._0_8_,7);
            uStack_460._0_1_ = (char)zDb._8_8_;
            uStack_460._1_1_ = SUB81(zDb._8_8_,1);
            uStack_460._2_1_ = SUB81(zDb._8_8_,2);
            uStack_460._3_1_ = SUB81(zDb._8_8_,3);
            uStack_460._4_1_ = SUB81(zDb._8_8_,4);
            uStack_460._5_1_ = SUB81(zDb._8_8_,5);
            uStack_460._6_1_ = SUB81(zDb._8_8_,6);
            uStack_460._7_1_ = SUB81(zDb._8_8_,7);
            auVar25[0] = -((char)((unixFileId *)&psVar15->iVersion)->dev == (char)openMode);
            auVar25[1] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 1) ==
                          openMode._1_1_);
            auVar25[2] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 2) ==
                          openMode._2_1_);
            auVar25[3] = -(*(char *)((long)&((unixFileId *)&psVar15->iVersion)->dev + 3) ==
                          openMode._3_1_);
            auVar25[4] = -(psVar15->field_0x4 == cStack_464);
            auVar25[5] = -(psVar15->field_0x5 == cStack_463);
            auVar25[6] = -(psVar15->field_0x6 == cStack_462);
            auVar25[7] = -(psVar15->field_0x7 == cStack_461);
            auVar25[8] = -(*(char *)&psVar15->xClose == (char)uStack_460);
            auVar25[9] = -(*(char *)((long)&psVar15->xClose + 1) == uStack_460._1_1_);
            auVar25[10] = -(*(char *)((long)&psVar15->xClose + 2) == uStack_460._2_1_);
            auVar25[0xb] = -(*(char *)((long)&psVar15->xClose + 3) == uStack_460._3_1_);
            auVar25[0xc] = -(*(char *)((long)&psVar15->xClose + 4) == uStack_460._4_1_);
            auVar25[0xd] = -(*(char *)((long)&psVar15->xClose + 5) == uStack_460._5_1_);
            auVar25[0xe] = -(*(char *)((long)&psVar15->xClose + 6) == uStack_460._6_1_);
            auVar25[0xf] = -(*(char *)((long)&psVar15->xClose + 7) == uStack_460._7_1_);
            if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
              *(int *)&psVar15->xFileSize = *(int *)&psVar15->xFileSize + 1;
              psVar12 = (sqlite3_io_methods *)inodeList;
              goto LAB_001181f7;
            }
            ppuVar22 = (unixInodeInfo **)&psVar15->xUnlock;
          }
          psVar15 = (sqlite3_io_methods *)sqlite3_malloc64(0x50);
          iVar11 = 7;
          if (psVar15 == (sqlite3_io_methods *)0x0) goto LAB_00117f70;
          *(undefined1 (*) [16])&psVar15->xUnlock = (undefined1  [16])0x0;
          psVar15->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
          psVar15->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
          psVar15->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
          psVar15->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
          *(undefined1 (*) [16])&psVar15->xRead = (undefined1  [16])0x0;
          *(ulong *)psVar15 = _openMode;
          psVar15->xClose = uStack_460;
          if (sqlite3Config.bCoreMutex != '\0') {
            psVar16 = sqlite3_mutex_alloc(0);
            psVar15->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)psVar16;
            if (psVar16 == (sqlite3_mutex *)0x0) {
              sqlite3_free(psVar15);
              goto LAB_00117f70;
            }
          }
          *(int *)&psVar15->xFileSize = 1;
          psVar15->xUnlock = (_func_int_sqlite3_file_ptr_int *)inodeList;
          psVar15->xCheckReservedLock = (_func_int_sqlite3_file_ptr_int_ptr *)0x0;
          psVar12 = psVar15;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = (unixInodeInfo *)psVar15;
          }
LAB_001181f7:
          inodeList = (unixInodeInfo *)psVar12;
          pFile[2].pMethods = psVar15;
          iVar11 = 0;
        }
        else {
          piVar14 = __errno_location();
          *(int *)&pFile[4].pMethods = *piVar14;
          iVar11 = 10;
LAB_00117f70:
          robust_close((unixFile *)pFile,uVar23,0xacd2);
          uVar23 = 0xffffffff;
        }
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
      }
      else {
        psVar20 = &dotlockIoMethods;
        if (psVar12 != &dotlockIoMethods) goto LAB_00117e89;
        sVar13 = strlen((char *)psVar15);
        iVar17 = (int)sVar13 + 6;
        psVar12 = (sqlite3_io_methods *)sqlite3_malloc64((long)iVar17);
        if (psVar12 == (sqlite3_io_methods *)0x0) {
          iVar11 = 7;
        }
        else {
          iVar11 = 0;
          sqlite3_snprintf(iVar17,(char *)psVar12,"%s.lock",psVar15);
        }
        pFile[5].pMethods = psVar12;
      }
      *(undefined4 *)&pFile[4].pMethods = 0;
      psVar12 = psVar20;
      if (iVar11 != 0) {
        if (-1 < (int)uVar23) {
          robust_close((unixFile *)pFile,uVar23,0xad27);
        }
        goto LAB_0011829c;
      }
    }
    pFile->pMethods = psVar12;
    verifyDbFile((unixFile *)pFile);
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0x0FFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a super- or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_SUPER_JOURNAL
     || eType==SQLITE_OPEN_MAIN_JOURNAL
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true:
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and super-journal are never
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_SUPER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_SUPER_JOURNAL
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

#ifdef SQLITE_ASSERT_NO_FILES
  /* Applications that never read or write a persistent disk files */
  assert( zName==0 );
#endif

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY|O_NOFOLLOW);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        UnixUnusedFd *pReadonly = 0;
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        pReadonly = findReusableFd(zName, flags);
        if( pReadonly ){
          fd = pReadonly->fd;
          sqlite3_free(pReadonly);
        }else{
          fd = robust_open(zName, openFlags, openMode);
        }
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* The owner of the rollback journal or WAL file should always be the
    ** same as the owner of the database file.  Try to ensure that this is
    ** the case.  The chown() system call will be a no-op if the current
    ** process lacks root privileges, be we should at least try.  Without
    ** this step, if a root process opens a database file, it can leave
    ** behinds a journal/WAL that is owned by root and hence make the
    ** database inaccessible to unprivileged processes.
    **
    ** If openMode==0, then that means uid and gid are not set correctly
    ** (probably because SQLite is configured to use 8+3 filename mode) and
    ** in that case we do not want to attempt the chown().
    */
    if( openMode && (flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL))!=0 ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags =
                          flags & (SQLITE_OPEN_READONLY|SQLITE_OPEN_READWRITE);
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile
          ** and clear all the structure's references.  Specifically,
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif

  assert( zPath==0 || zPath[0]=='/'
      || eType==SQLITE_OPEN_SUPER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}